

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_GetMethodElement
              (Var instance,Var index,ScriptContext *scriptContext)

{
  code *pcVar1;
  ThreadContext *pTVar2;
  RecyclableObject *scriptContext_00;
  Var pvVar3;
  bool bVar4;
  BOOL BVar5;
  PropertyId PVar6;
  JavascriptString *pJVar7;
  undefined4 *puVar8;
  JavascriptString *varName_1;
  JavascriptString *varName;
  PropertyRecord *debugPropertyRecord;
  JavascriptString *indexStr;
  IndexType indexType;
  BOOL hasProperty;
  Var value;
  PropertyRecord *propertyRecord;
  uint32 indexVal;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  RecyclableObject *object;
  ScriptContext *scriptContext_local;
  Var index_local;
  Var instance_local;
  
  threadContext = (ThreadContext *)0x0;
  object = (RecyclableObject *)scriptContext;
  scriptContext_local = (ScriptContext *)index;
  index_local = instance;
  BVar5 = GetPropertyObject(instance,scriptContext,(RecyclableObject **)&threadContext);
  scriptContext_00 = object;
  if (BVar5 == 0) {
    pJVar7 = GetPropertyDisplayNameForError(scriptContext_local,(ScriptContext *)object);
    JavascriptError::ThrowTypeError((ScriptContext *)scriptContext_00,-0x7ff5ec48,pJVar7);
  }
  _indexVal = ScriptContext::GetThreadContext((ScriptContext *)object);
  propertyRecord._7_1_ = ThreadContext::GetImplicitCallFlags(_indexVal);
  ThreadContext::ClearImplicitCallFlags(_indexVal);
  value = (Var)0x0;
  _indexType = (RecyclableObject *)0x0;
  indexStr._4_4_ = 0;
  indexStr._0_4_ =
       GetIndexType(&scriptContext_local,(ScriptContext *)object,(uint32 *)&propertyRecord,
                    (PropertyRecord **)&value,false);
  if ((IndexType)indexStr == IndexType_Number) {
    indexStr._4_4_ =
         GetItemReference(index_local,(RecyclableObject *)threadContext,(uint32)propertyRecord,
                          (Var *)&indexType,(ScriptContext *)object);
  }
  else {
    if ((IndexType)indexStr != IndexType_PropertyId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1165,"(indexType == IndexType_PropertyId)",
                                  "indexType == IndexType_PropertyId");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if ((value == (Var)0x0) &&
       (bVar4 = CanShortcutOnUnknownPropertyName((RecyclableObject *)threadContext), !bVar4)) {
      indexStr._0_4_ =
           GetIndexTypeFromPrimitive
                     (scriptContext_local,(ScriptContext *)object,(uint32 *)&propertyRecord,
                      (PropertyRecord **)&value,true);
      if ((IndexType)indexStr != IndexType_PropertyId) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x116a,"(indexType == IndexType_PropertyId)",
                                    "indexType == IndexType_PropertyId");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (value == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x116b,"(propertyRecord != nullptr)",
                                    "propertyRecord != nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    pvVar3 = index_local;
    pTVar2 = threadContext;
    if (value == (Var)0x0) {
      debugPropertyRecord =
           (PropertyRecord *)
           JavascriptConversion::ToString(scriptContext_local,(ScriptContext *)object);
      ScriptContext::GetOrAddPropertyRecord
                ((ScriptContext *)object,(JavascriptString *)debugPropertyRecord,
                 (PropertyRecord **)&varName);
      pvVar3 = index_local;
      pTVar2 = threadContext;
      PVar6 = PropertyRecord::GetPropertyId((PropertyRecord *)varName);
      BVar5 = GetPropertyReference
                        (pvVar3,(RecyclableObject *)pTVar2,PVar6,(Var *)&indexType,
                         (ScriptContext *)object,(PropertyValueInfo *)0x0);
      if (BVar5 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x1179,
                                    "(!JavascriptOperators::GetPropertyReference(instance, object, debugPropertyRecord->GetPropertyId(), &value, scriptContext, __null))"
                                    ,
                                    "how did this property come? See OS Bug 2727708 if you see this come from the web"
                                   );
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    else {
      PVar6 = PropertyRecord::GetPropertyId((PropertyRecord *)value);
      indexStr._4_4_ =
           GetPropertyReference
                     (pvVar3,(RecyclableObject *)pTVar2,PVar6,(Var *)&indexType,
                      (ScriptContext *)object,(PropertyValueInfo *)0x0);
    }
  }
  if (indexStr._4_4_ == 0) {
    if ((((IndexType)indexStr == IndexType_PropertyId) && (value != (Var)0x0)) &&
       (bVar4 = PropertyRecord::IsSymbol((PropertyRecord *)value), bVar4)) {
      varName_1 = JavascriptSymbol::ToString((PropertyRecord *)value,(ScriptContext *)object);
    }
    else {
      varName_1 = JavascriptConversion::ToString(scriptContext_local,(ScriptContext *)object);
    }
    _indexType = ThrowErrorObject::CreateThrowTypeErrorObject
                           ((ScriptContext *)object,-0x7ff5fe4a,varName_1);
  }
  else {
    bVar4 = JavascriptConversion::IsCallable(_indexType);
    if (!bVar4) {
      pJVar7 = JavascriptConversion::ToString(scriptContext_local,(ScriptContext *)object);
      _indexType = ThrowErrorObject::CreateThrowTypeErrorObject
                             ((ScriptContext *)object,-0x7ff5ec45,pJVar7);
    }
  }
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(_indexVal);
  ThreadContext::AddImplicitCallFlags(_indexVal,propertyRecord._7_1_);
  return _indexType;
}

Assistant:

Var JavascriptOperators::OP_GetMethodElement(Var instance, Var index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_GetMethodElement);
        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined, GetPropertyDisplayNameForError(index, scriptContext));
        }

        ThreadContext* threadContext = scriptContext->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;
        Var value = NULL;
        BOOL hasProperty = FALSE;
        IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, false);

        if (indexType == IndexType_Number)
        {
            hasProperty = JavascriptOperators::GetItemReference(instance, object, indexVal, &value, scriptContext);
        }
        else
        {
            Assert(indexType == IndexType_PropertyId);

            if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
            {
                indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, true);
                Assert(indexType == IndexType_PropertyId);
                Assert(propertyRecord != nullptr);
            }

            if (propertyRecord != nullptr)
            {
                hasProperty = JavascriptOperators::GetPropertyReference(instance, object, propertyRecord->GetPropertyId(), &value, scriptContext, NULL);
            }
#if DBG
            else
            {
                JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                PropertyRecord const * debugPropertyRecord;
                scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                AssertMsg(!JavascriptOperators::GetPropertyReference(instance, object, debugPropertyRecord->GetPropertyId(), &value, scriptContext, NULL),
                          "how did this property come? See OS Bug 2727708 if you see this come from the web");
            }
#endif
        }

        if (!hasProperty)
        {
            JavascriptString* varName = nullptr;
            if (indexType == IndexType_PropertyId && propertyRecord != nullptr && propertyRecord->IsSymbol())
            {
                varName = JavascriptSymbol::ToString(propertyRecord, scriptContext);
            }
            else
            {
                varName = JavascriptConversion::ToString(index, scriptContext);
            }

            // ES5 11.2.3 #2: We evaluate the call target but don't throw yet if target member is missing. We need to evaluate argList
            // first (#3). Postpone throwing error to invoke time.
            value = ThrowErrorObject::CreateThrowTypeErrorObject(scriptContext, VBSERR_OLENoPropOrMethod, varName);
        }
        else if(!JavascriptConversion::IsCallable(value))
        {
            // ES5 11.2.3 #2: We evaluate the call target but don't throw yet if target member is missing. We need to evaluate argList
            // first (#3). Postpone throwing error to invoke time.
            JavascriptString* varName = JavascriptConversion::ToString(index, scriptContext);
            value = ThrowErrorObject::CreateThrowTypeErrorObject(scriptContext, JSERR_Property_NeedFunction, varName);
        }

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
        return value;
        JIT_HELPER_END(Op_GetMethodElement);
    }